

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QByteArray,QByteArray>>::emplace<QByteArray_const&,QByteArray>
          (QMovableArrayOps<std::pair<QByteArray,QByteArray>> *this,qsizetype i,QByteArray *args,
          QByteArray *args_1)

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  Inserter local_90;
  pair<QByteArray,_QByteArray> local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar2 = QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this);
      if (qVar2 == 0) goto LAB_001981f5;
      std::pair<QByteArray,_QByteArray>::pair<QByteArray,_true>
                ((pair<QByteArray,_QByteArray> *)
                 (*(long *)(this + 0x10) * 0x30 + *(long *)(this + 8)),args,args_1);
LAB_001982ec:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_001982a6;
    }
LAB_001981f5:
    if (i == 0) {
      qVar2 = QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this);
      if (qVar2 != 0) {
        std::pair<QByteArray,_QByteArray>::pair<QByteArray,_true>
                  ((pair<QByteArray,_QByteArray> *)(*(long *)(this + 8) + -0x30),args,args_1);
        *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
        goto LAB_001982ec;
      }
    }
  }
  local_68.second.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_68.second.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.first.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.second.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.first.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.first.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  std::pair<QByteArray,_QByteArray>::pair<QByteArray,_true>(&local_68,args,args_1);
  lVar1 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this,
             (uint)(i == 0 && lVar1 != 0),1,(pair<QByteArray,_QByteArray> **)0x0,
             (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0);
  if (i == 0 && lVar1 != 0) {
    std::pair<QByteArray,_QByteArray>::pair
              ((pair<QByteArray,_QByteArray> *)(*(long *)(this + 8) + -0x30),&local_68);
    *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<std::pair<QByteArray,_QByteArray>_>::Inserter::Inserter
              (&local_90,(QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this,i,1);
    std::pair<QByteArray,_QByteArray>::pair(local_90.displaceFrom,&local_68);
    local_90.displaceFrom = local_90.displaceFrom + 1;
    (local_90.data)->size = (local_90.data)->size + local_90.nInserts;
  }
  std::pair<QByteArray,_QByteArray>::~pair(&local_68);
LAB_001982a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }